

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::recoverboundary(tetgenmesh *this,clock_t *tv)

{
  memorypool *pmVar1;
  void **ppvVar2;
  point pdVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  tetgenbehavior *ptVar7;
  arraypool *misseglist;
  arraypool *this_00;
  unsigned_long uVar8;
  char *pcVar9;
  void *pvVar10;
  char *pcVar11;
  clock_t cVar12;
  arraypool *paVar13;
  arraypool *paVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  long local_48;
  
  ptVar7 = this->b;
  if (ptVar7->quiet == 0) {
    puts("Recovering boundaries...");
    ptVar7 = this->b;
  }
  if (ptVar7->verbose != 0) {
    puts("  Recovering segments.");
  }
  this->checksubsegflag = 1;
  misseglist = (arraypool *)operator_new(0x30);
  misseglist->objectbytes = 0x10;
  misseglist->objectsperblock = 0x100;
  misseglist->log2objectsperblock = 8;
  misseglist->objectsperblockmark = 0xff;
  misseglist->toparraylen = 0;
  misseglist->toparray = (char **)0x0;
  misseglist->objects = 0;
  misseglist->totalmemory = 0;
  this_00 = (arraypool *)operator_new(0x30);
  this_00->objectbytes = 8;
  this_00->objectsperblock = 0x100;
  this_00->log2objectsperblock = 8;
  this_00->objectsperblockmark = 0xff;
  this_00->toparraylen = 0;
  this_00->toparray = (char **)0x0;
  this_00->objects = 0;
  this_00->totalmemory = 0;
  pmVar1 = this->subsegs;
  ppvVar2 = pmVar1->firstblock;
  pmVar1->pathblock = ppvVar2;
  pmVar1->pathitem =
       (void *)((long)ppvVar2 +
               (((long)pmVar1->alignbytes + 8U) -
               (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
  pmVar1->pathitemsleft = pmVar1->itemsperblock;
  lVar15 = pmVar1->items;
  if (0 < lVar15) {
    lVar20 = 0;
    do {
      lVar20 = lVar20 + 1;
      uVar8 = randomnation(this,(uint)lVar20);
      paVar13 = this->subsegstack;
      pcVar9 = arraypool::getblock(paVar13,(int)paVar13->objects);
      lVar17 = (long)paVar13->objectbytes * ((long)paVar13->objectsperblock - 1U & paVar13->objects)
      ;
      paVar13->objects = paVar13->objects + 1;
      paVar13 = this->subsegstack;
      uVar16 = (uint)uVar8;
      pcVar11 = paVar13->toparray[(int)uVar16 >> ((byte)paVar13->log2objectsperblock & 0x1f)];
      lVar15 = (long)paVar13->objectbytes * (long)(int)(paVar13->objectsperblockmark & uVar16);
      *(undefined8 *)(pcVar9 + lVar17) = *(undefined8 *)(pcVar11 + lVar15);
      *(undefined4 *)(pcVar9 + lVar17 + 8) = *(undefined4 *)(pcVar11 + lVar15 + 8);
      pmVar1 = this->subsegs;
      do {
        pvVar10 = memorypool::traverse(pmVar1);
        if (pvVar10 == (void *)0x0) break;
      } while (*(long *)((long)pvVar10 + 0x18) == 0);
      paVar13 = this->subsegstack;
      pcVar11 = paVar13->toparray[(int)uVar16 >> ((byte)paVar13->log2objectsperblock & 0x1f)];
      lVar15 = (long)paVar13->objectbytes * (long)(int)(uVar16 & paVar13->objectsperblockmark);
      *(void **)(pcVar11 + lVar15) = pvVar10;
      pcVar11 = pcVar11 + lVar15 + 8;
      pcVar11[0] = '\0';
      pcVar11[1] = '\0';
      pcVar11[2] = '\0';
      pcVar11[3] = '\0';
      lVar15 = this->subsegs->items;
    } while (lVar20 < lVar15);
  }
  if (this->b->fliplinklevel < 0) {
    this->autofliplinklevel = 1;
  }
  iVar6 = 0;
  while( true ) {
    recoversegments(this,misseglist,0,0);
    lVar20 = misseglist->objects;
    if ((lVar20 < 1) || (-1 < this->b->fliplinklevel)) break;
    if (lVar20 < lVar15) {
      iVar19 = iVar6 - (uint)(0 < iVar6);
      lVar15 = lVar20;
    }
    else {
      iVar19 = iVar6 + 1;
      if (1 < iVar6) {
        this->b->fliplinklevel = 100000;
      }
    }
    lVar20 = 0;
    do {
      paVar13 = this->subsegstack;
      pcVar9 = arraypool::getblock(paVar13,(int)paVar13->objects);
      lVar17 = (long)paVar13->objectbytes * ((long)paVar13->objectsperblock - 1U & paVar13->objects)
      ;
      paVar13->objects = paVar13->objects + 1;
      pcVar11 = misseglist->toparray[(uint)lVar20 >> ((byte)misseglist->log2objectsperblock & 0x1f)]
      ;
      lVar18 = (long)misseglist->objectbytes *
               (long)(int)(misseglist->objectsperblockmark & (uint)lVar20);
      *(undefined8 *)(pcVar9 + lVar17) = *(undefined8 *)(pcVar11 + lVar18);
      *(undefined4 *)(pcVar9 + lVar17 + 8) = *(undefined4 *)(pcVar11 + lVar18 + 8);
      lVar20 = lVar20 + 1;
    } while (lVar20 < misseglist->objects);
    ptVar7 = this->b;
    misseglist->objects = 0;
    this->autofliplinklevel = this->autofliplinklevel + ptVar7->fliplinklevelinc;
    iVar6 = iVar19;
  }
  if (this->b->verbose != 0) {
    printf("  %ld (%ld) segments are recovered (missing).\n",this->subsegs->items - lVar20,lVar20);
    lVar20 = misseglist->objects;
  }
  if (0 < lVar20) {
    do {
      lVar15 = lVar20;
      if (lVar20 < 1) break;
      lVar15 = 0;
      do {
        paVar13 = this->subsegstack;
        pcVar9 = arraypool::getblock(paVar13,(int)paVar13->objects);
        lVar17 = (long)paVar13->objectbytes *
                 ((long)paVar13->objectsperblock - 1U & paVar13->objects);
        paVar13->objects = paVar13->objects + 1;
        pcVar11 = misseglist->toparray
                  [(uint)lVar15 >> ((byte)misseglist->log2objectsperblock & 0x1f)];
        lVar18 = (long)misseglist->objectbytes *
                 (long)(int)(misseglist->objectsperblockmark & (uint)lVar15);
        *(undefined8 *)(pcVar9 + lVar17) = *(undefined8 *)(pcVar11 + lVar18);
        *(undefined4 *)(pcVar9 + lVar17 + 8) = *(undefined4 *)(pcVar11 + lVar18 + 8);
        lVar15 = lVar15 + 1;
      } while (lVar15 < misseglist->objects);
      misseglist->objects = 0;
      recoversegments(this,misseglist,1,0);
      lVar15 = misseglist->objects;
      bVar5 = lVar15 < lVar20;
      lVar20 = lVar15;
    } while (bVar5);
    if (this->b->verbose != 0) {
      printf("  %ld (%ld) segments are recovered (missing).\n",this->subsegs->items - lVar15,lVar15)
      ;
      lVar15 = misseglist->objects;
    }
    if (0 < lVar15) {
      do {
        lVar20 = lVar15;
        if (lVar15 < 1) break;
        lVar20 = 0;
        do {
          paVar13 = this->subsegstack;
          pcVar9 = arraypool::getblock(paVar13,(int)paVar13->objects);
          lVar17 = (long)paVar13->objectbytes *
                   ((long)paVar13->objectsperblock - 1U & paVar13->objects);
          paVar13->objects = paVar13->objects + 1;
          pcVar11 = misseglist->toparray
                    [(uint)lVar20 >> ((byte)misseglist->log2objectsperblock & 0x1f)];
          lVar18 = (long)misseglist->objectbytes *
                   (long)(int)(misseglist->objectsperblockmark & (uint)lVar20);
          *(undefined8 *)(pcVar9 + lVar17) = *(undefined8 *)(pcVar11 + lVar18);
          *(undefined4 *)(pcVar9 + lVar17 + 8) = *(undefined4 *)(pcVar11 + lVar18 + 8);
          lVar20 = lVar20 + 1;
        } while (lVar20 < misseglist->objects);
        misseglist->objects = 0;
        recoversegments(this,misseglist,1,1);
        lVar20 = misseglist->objects;
        bVar5 = lVar20 < lVar15;
        lVar15 = lVar20;
      } while (bVar5);
      if (this->b->verbose != 0) {
        printf("  Added %ld Steiner points in volume.\n",this->st_volref_count);
        lVar20 = misseglist->objects;
      }
      if (0 < lVar20) {
        lVar15 = this->st_volref_count;
        lVar20 = 0;
        do {
          paVar13 = this->subsegstack;
          pcVar9 = arraypool::getblock(paVar13,(int)paVar13->objects);
          lVar17 = (long)paVar13->objectbytes *
                   ((long)paVar13->objectsperblock - 1U & paVar13->objects);
          paVar13->objects = paVar13->objects + 1;
          pcVar11 = misseglist->toparray
                    [(uint)lVar20 >> ((byte)misseglist->log2objectsperblock & 0x1f)];
          lVar18 = (long)misseglist->objectbytes *
                   (long)(int)(misseglist->objectsperblockmark & (uint)lVar20);
          *(undefined8 *)(pcVar9 + lVar17) = *(undefined8 *)(pcVar11 + lVar18);
          *(undefined4 *)(pcVar9 + lVar17 + 8) = *(undefined4 *)(pcVar11 + lVar18 + 8);
          lVar20 = lVar20 + 1;
        } while (lVar20 < misseglist->objects);
        misseglist->objects = 0;
        recoversegments(this,misseglist,1,2);
        if ((this->b->verbose != 0) &&
           (printf("  Added %ld Steiner points in segments.\n",this->st_segref_count),
           lVar15 < this->st_volref_count)) {
          printf("  Added another %ld Steiner points in volume.\n");
        }
      }
    }
  }
  lVar15 = this->st_segref_count;
  if (lVar15 < 1) {
    local_48 = 0;
  }
  else {
    paVar13 = this->subvertstack;
    if (paVar13->objects < 1) {
      local_48 = 0;
    }
    else {
      lVar20 = this->st_volref_count;
      local_48 = 0;
      lVar17 = 0;
      do {
        pdVar3 = *(point *)(paVar13->toparray
                            [(uint)lVar17 >> ((byte)paVar13->log2objectsperblock & 0x1f)] +
                           (long)paVar13->objectbytes *
                           (long)(int)(paVar13->objectsperblockmark & (uint)lVar17));
        iVar6 = removevertexbyflips(this,pdVar3);
        if (iVar6 == 0) {
          pcVar11 = arraypool::getblock(this_00,(int)local_48);
          uVar4 = this_00->objects;
          local_48 = uVar4 + 1;
          this_00->objects = local_48;
          *(point *)(pcVar11 +
                    (long)this_00->objectbytes * ((long)this_00->objectsperblock - 1U & uVar4)) =
               pdVar3;
        }
        lVar17 = lVar17 + 1;
        paVar13 = this->subvertstack;
      } while (lVar17 < paVar13->objects);
      lVar17 = this->st_segref_count;
      if (lVar17 < lVar15 && this->b->verbose != 0) {
        lVar18 = this->st_volref_count;
        if (lVar20 < lVar18) {
          printf("  Suppressed %ld Steiner points in segments.\n");
          lVar17 = this->st_segref_count;
          lVar18 = this->st_volref_count;
        }
        lVar17 = (lVar18 - lVar20) + lVar17;
        lVar20 = lVar15 - lVar17;
        if (lVar20 != 0 && lVar17 <= lVar15) {
          printf("  Removed %ld Steiner points in segments.\n",lVar20);
        }
      }
    }
    this->subvertstack->objects = 0;
  }
  cVar12 = clock();
  *tv = cVar12;
  if (this->b->verbose != 0) {
    puts("  Recovering facets.");
  }
  this->checksubfaceflag = 1;
  paVar13 = (arraypool *)operator_new(0x30);
  paVar13->objectbytes = 0x10;
  paVar13->objectsperblock = 0x100;
  paVar13->log2objectsperblock = 8;
  paVar13->objectsperblockmark = 0xff;
  paVar13->toparraylen = 0;
  paVar13->toparray = (char **)0x0;
  paVar13->objects = 0;
  paVar13->totalmemory = 0;
  pmVar1 = this->subfaces;
  ppvVar2 = pmVar1->firstblock;
  pmVar1->pathblock = ppvVar2;
  pmVar1->pathitem =
       (void *)((long)ppvVar2 +
               (((long)pmVar1->alignbytes + 8U) -
               (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
  pmVar1->pathitemsleft = pmVar1->itemsperblock;
  lVar15 = pmVar1->items;
  if (0 < lVar15) {
    lVar20 = 0;
    do {
      lVar20 = lVar20 + 1;
      uVar8 = randomnation(this,(uint)lVar20);
      paVar14 = this->subfacstack;
      pcVar9 = arraypool::getblock(paVar14,(int)paVar14->objects);
      lVar17 = (long)paVar14->objectbytes * ((long)paVar14->objectsperblock - 1U & paVar14->objects)
      ;
      paVar14->objects = paVar14->objects + 1;
      paVar14 = this->subfacstack;
      uVar16 = (uint)uVar8;
      pcVar11 = paVar14->toparray[(int)uVar16 >> ((byte)paVar14->log2objectsperblock & 0x1f)];
      lVar15 = (long)paVar14->objectbytes * (long)(int)(paVar14->objectsperblockmark & uVar16);
      *(undefined8 *)(pcVar9 + lVar17) = *(undefined8 *)(pcVar11 + lVar15);
      *(undefined4 *)(pcVar9 + lVar17 + 8) = *(undefined4 *)(pcVar11 + lVar15 + 8);
      pmVar1 = this->subfaces;
      do {
        pvVar10 = memorypool::traverse(pmVar1);
        if (pvVar10 == (void *)0x0) break;
      } while (*(long *)((long)pvVar10 + 0x18) == 0);
      paVar14 = this->subfacstack;
      pcVar11 = paVar14->toparray[(int)uVar16 >> ((byte)paVar14->log2objectsperblock & 0x1f)];
      lVar15 = (long)paVar14->objectbytes * (long)(int)(uVar16 & paVar14->objectsperblockmark);
      *(void **)(pcVar11 + lVar15) = pvVar10;
      pcVar11 = pcVar11 + lVar15 + 8;
      pcVar11[0] = '\0';
      pcVar11[1] = '\0';
      pcVar11[2] = '\0';
      pcVar11[3] = '\0';
      lVar15 = this->subfaces->items;
    } while (lVar20 < lVar15);
  }
  this->b->fliplinklevel = -1;
  this->autofliplinklevel = 1;
  recoversubfaces(this,paVar13,0);
  lVar20 = paVar13->objects;
  iVar6 = 0;
  while ((0 < lVar20 && (this->b->fliplinklevel < 0))) {
    if (lVar20 < lVar15) {
      iVar19 = iVar6 - (uint)(0 < iVar6);
      lVar15 = lVar20;
    }
    else {
      iVar19 = iVar6 + 1;
      if (1 < iVar6) {
        this->b->fliplinklevel = 100000;
      }
    }
    lVar20 = 0;
    do {
      paVar14 = this->subfacstack;
      pcVar9 = arraypool::getblock(paVar14,(int)paVar14->objects);
      lVar17 = (long)paVar14->objectbytes * ((long)paVar14->objectsperblock - 1U & paVar14->objects)
      ;
      paVar14->objects = paVar14->objects + 1;
      pcVar11 = paVar13->toparray[(uint)lVar20 >> ((byte)paVar13->log2objectsperblock & 0x1f)];
      lVar18 = (long)paVar13->objectbytes * (long)(int)(paVar13->objectsperblockmark & (uint)lVar20)
      ;
      *(undefined8 *)(pcVar9 + lVar17) = *(undefined8 *)(pcVar11 + lVar18);
      *(undefined4 *)(pcVar9 + lVar17 + 8) = *(undefined4 *)(pcVar11 + lVar18 + 8);
      lVar20 = lVar20 + 1;
    } while (lVar20 < paVar13->objects);
    ptVar7 = this->b;
    paVar13->objects = 0;
    this->autofliplinklevel = this->autofliplinklevel + ptVar7->fliplinklevelinc;
    recoversubfaces(this,paVar13,0);
    lVar20 = paVar13->objects;
    iVar6 = iVar19;
  }
  if (this->b->verbose != 0) {
    printf("  %ld (%ld) subfaces are recovered (missing).\n",this->subfaces->items - lVar20);
    lVar20 = paVar13->objects;
  }
  if (0 < lVar20) {
    lVar15 = 0;
    do {
      paVar14 = this->subfacstack;
      pcVar9 = arraypool::getblock(paVar14,(int)paVar14->objects);
      lVar20 = (long)paVar14->objectbytes * ((long)paVar14->objectsperblock - 1U & paVar14->objects)
      ;
      paVar14->objects = paVar14->objects + 1;
      pcVar11 = paVar13->toparray[(uint)lVar15 >> ((byte)paVar13->log2objectsperblock & 0x1f)];
      lVar17 = (long)paVar13->objectbytes * (long)(int)(paVar13->objectsperblockmark & (uint)lVar15)
      ;
      *(undefined8 *)(pcVar9 + lVar20) = *(undefined8 *)(pcVar11 + lVar17);
      *(undefined4 *)(pcVar9 + lVar20 + 8) = *(undefined4 *)(pcVar11 + lVar17 + 8);
      lVar15 = lVar15 + 1;
    } while (lVar15 < paVar13->objects);
    paVar13->objects = 0;
    recoversubfaces(this,(arraypool *)0x0,1);
    if (this->b->verbose != 0) {
      printf("  Added %ld Steiner points in facets.\n",this->st_facref_count);
    }
  }
  lVar15 = this->st_facref_count;
  if (0 < lVar15) {
    paVar14 = this->subvertstack;
    if (0 < paVar14->objects) {
      lVar20 = 0;
      do {
        pdVar3 = *(point *)(paVar14->toparray
                            [(uint)lVar20 >> ((byte)paVar14->log2objectsperblock & 0x1f)] +
                           (long)paVar14->objectbytes *
                           (long)(int)(paVar14->objectsperblockmark & (uint)lVar20));
        iVar6 = removevertexbyflips(this,pdVar3);
        if (iVar6 == 0) {
          pcVar11 = arraypool::getblock(this_00,(int)local_48);
          uVar4 = this_00->objects;
          local_48 = uVar4 + 1;
          this_00->objects = local_48;
          *(point *)(pcVar11 +
                    (long)this_00->objectbytes * ((long)this_00->objectsperblock - 1U & uVar4)) =
               pdVar3;
        }
        lVar20 = lVar20 + 1;
        paVar14 = this->subvertstack;
      } while (lVar20 < paVar14->objects);
    }
    if ((this->b->verbose != 0) && (this->st_facref_count < lVar15)) {
      printf("  Removed %ld Steiner points in facets.\n");
      paVar14 = this->subvertstack;
    }
    paVar14->objects = 0;
    local_48 = this_00->objects;
  }
  if ((0 < local_48) && (this->b->verbose != 0)) {
    printf("  %ld Steiner points remained in boundary.\n");
  }
  this->totalworkmemory =
       this->totalworkmemory + paVar13->totalmemory + misseglist->totalmemory + this_00->totalmemory
  ;
  arraypool::~arraypool(this_00);
  operator_delete(this_00,0x30);
  arraypool::~arraypool(misseglist);
  operator_delete(misseglist,0x30);
  arraypool::~arraypool(paVar13);
  operator_delete(paVar13,0x30);
  return;
}

Assistant:

void tetgenmesh::recoverboundary(clock_t& tv)
{
  arraypool *misseglist, *misshlist;
  arraypool *bdrysteinerptlist;
  face searchsh, *parysh;
  face searchseg, *paryseg;
  point rempt, *parypt;
  long ms; // The number of missing segments/subfaces.
  int nit; // The number of iterations.
  int s, i;

  // Counters.
  long bak_segref_count, bak_facref_count, bak_volref_count;

  if (!b->quiet) {
    printf("Recovering boundaries...\n");
  }


  if (b->verbose) {
    printf("  Recovering segments.\n");
  }

  // Segments will be introduced.
  checksubsegflag = 1;

  misseglist = new arraypool(sizeof(face), 8);
  bdrysteinerptlist = new arraypool(sizeof(point), 8);

  // In random order.
  subsegs->traversalinit();
  for (i = 0; i < subsegs->items; i++) {
    s = randomnation(i + 1);
    // Move the s-th seg to the i-th.
    subsegstack->newindex((void **) &paryseg);
    *paryseg = * (face *) fastlookup(subsegstack, s);
    // Put i-th seg to be the s-th.
    searchseg.sh = shellfacetraverse(subsegs);
    paryseg = (face *) fastlookup(subsegstack, s);
    *paryseg = searchseg;
  }

  // The init number of missing segments.
  ms = subsegs->items;
  nit = 0; 
  if (b->fliplinklevel < 0) {
    autofliplinklevel = 1; // Init value.
  }

  // First, trying to recover segments by only doing flips.
  while (1) {
    recoversegments(misseglist, 0, 0);

    if (misseglist->objects > 0) {
      if (b->fliplinklevel >= 0) {
        break;
      } else {
        if (misseglist->objects >= ms) {
          nit++;
          if (nit >= 3) {
            //break;
            // Do the last round with unbounded flip link level.
            b->fliplinklevel = 100000;
          }
        } else {
          ms = misseglist->objects;
          if (nit > 0) {
            nit--;
          }
        }
        for (i = 0; i < misseglist->objects; i++) {
          subsegstack->newindex((void **) &paryseg);
          *paryseg = * (face *) fastlookup(misseglist, i);
        }
        misseglist->restart();
        autofliplinklevel+=b->fliplinklevelinc;
      }
    } else {
      // All segments are recovered.
      break;
    }
  } // while (1)

  if (b->verbose) {
    printf("  %ld (%ld) segments are recovered (missing).\n", 
           subsegs->items - misseglist->objects, misseglist->objects);
  }

  if (misseglist->objects > 0) {
    // Second, trying to recover segments by doing more flips (fullsearch).
    while (misseglist->objects > 0) {
      ms = misseglist->objects;
      for (i = 0; i < misseglist->objects; i++) {
        subsegstack->newindex((void **) &paryseg);
        *paryseg = * (face *) fastlookup(misseglist, i);
      }
      misseglist->restart();

      recoversegments(misseglist, 1, 0);

      if (misseglist->objects < ms) {
        // The number of missing segments is reduced.
        continue;
      } else {
        break;
      }
    }
    if (b->verbose) {
      printf("  %ld (%ld) segments are recovered (missing).\n", 
             subsegs->items - misseglist->objects, misseglist->objects);
    }
  }

  if (misseglist->objects > 0) {
    // Third, trying to recover segments by doing more flips (fullsearch)
    //   and adding Steiner points in the volume.
    while (misseglist->objects > 0) {
      ms = misseglist->objects;
      for (i = 0; i < misseglist->objects; i++) {
        subsegstack->newindex((void **) &paryseg);
        *paryseg = * (face *) fastlookup(misseglist, i);
      }
      misseglist->restart();

      recoversegments(misseglist, 1, 1);

      if (misseglist->objects < ms) {
        // The number of missing segments is reduced.
        continue;
      } else {
        break;
      }
    }
    if (b->verbose) {
      printf("  Added %ld Steiner points in volume.\n", st_volref_count);
    }
  }

  if (misseglist->objects > 0) {
    // Last, trying to recover segments by doing more flips (fullsearch),
    //   and adding Steiner points in the volume, and splitting segments.
    long bak_inpoly_count = st_volref_count; //st_inpoly_count;
    for (i = 0; i < misseglist->objects; i++) {
      subsegstack->newindex((void **) &paryseg);
      *paryseg = * (face *) fastlookup(misseglist, i);
    }
    misseglist->restart();

    recoversegments(misseglist, 1, 2);

    if (b->verbose) {
      printf("  Added %ld Steiner points in segments.\n", st_segref_count);
      if (st_volref_count > bak_inpoly_count) {
        printf("  Added another %ld Steiner points in volume.\n", 
               st_volref_count - bak_inpoly_count);
      }
    }
  }


  if (st_segref_count > 0) {
    // Try to remove the Steiner points added in segments.
    bak_segref_count = st_segref_count;
    bak_volref_count = st_volref_count;
    for (i = 0; i < subvertstack->objects; i++) {
      // Get the Steiner point.
      parypt = (point *) fastlookup(subvertstack, i);
      rempt = *parypt;
      if (!removevertexbyflips(rempt)) {
        // Save it in list.
        bdrysteinerptlist->newindex((void **) &parypt);
        *parypt = rempt;
      }
    }
    if (b->verbose) {
      if (st_segref_count < bak_segref_count) {
        if (bak_volref_count < st_volref_count) {
          printf("  Suppressed %ld Steiner points in segments.\n", 
                 st_volref_count - bak_volref_count);
        }
        if ((st_segref_count + (st_volref_count - bak_volref_count)) <
            bak_segref_count) {
          printf("  Removed %ld Steiner points in segments.\n", 
                 bak_segref_count - 
                   (st_segref_count + (st_volref_count - bak_volref_count)));
        }
      }
    }
    subvertstack->restart();
  }


  tv = clock();

  if (b->verbose) {
    printf("  Recovering facets.\n");
  }

  // Subfaces will be introduced.
  checksubfaceflag = 1;

  misshlist = new arraypool(sizeof(face), 8);

  // Randomly order the subfaces.
  subfaces->traversalinit();
  for (i = 0; i < subfaces->items; i++) {
    s = randomnation(i + 1);
    // Move the s-th subface to the i-th.
    subfacstack->newindex((void **) &parysh);
    *parysh = * (face *) fastlookup(subfacstack, s);
    // Put i-th subface to be the s-th.
    searchsh.sh = shellfacetraverse(subfaces);
    parysh = (face *) fastlookup(subfacstack, s);
    *parysh = searchsh;
  }

  ms = subfaces->items;
  nit = 0; 
  b->fliplinklevel = -1; // Init.
  if (b->fliplinklevel < 0) {
    autofliplinklevel = 1; // Init value.
  }

  while (1) {
    recoversubfaces(misshlist, 0);

    if (misshlist->objects > 0) {
      if (b->fliplinklevel >= 0) {
        break;
      } else {
        if (misshlist->objects >= ms) {
          nit++;
          if (nit >= 3) {
            //break;
            // Do the last round with unbounded flip link level.
            b->fliplinklevel = 100000;
          }
        } else {
          ms = misshlist->objects;
          if (nit > 0) {
            nit--;
          }
        }
        for (i = 0; i < misshlist->objects; i++) {
          subfacstack->newindex((void **) &parysh);
          *parysh = * (face *) fastlookup(misshlist, i);
        }
        misshlist->restart();
        autofliplinklevel+=b->fliplinklevelinc;
      }
    } else {
      // All subfaces are recovered.
      break;
    }
  } // while (1)

  if (b->verbose) {
    printf("  %ld (%ld) subfaces are recovered (missing).\n", 
           subfaces->items - misshlist->objects, misshlist->objects);
  }

  if (misshlist->objects > 0) {
    // There are missing subfaces. Add Steiner points.
    for (i = 0; i < misshlist->objects; i++) {
      subfacstack->newindex((void **) &parysh);
      *parysh = * (face *) fastlookup(misshlist, i);
    }
    misshlist->restart();

    recoversubfaces(NULL, 1);

    if (b->verbose) {
      printf("  Added %ld Steiner points in facets.\n", st_facref_count);
    }
  }


  if (st_facref_count > 0) {
    // Try to remove the Steiner points added in facets.
    bak_facref_count = st_facref_count;
    for (i = 0; i < subvertstack->objects; i++) {
      // Get the Steiner point.
      parypt = (point *) fastlookup(subvertstack, i);
      rempt = *parypt;
      if (!removevertexbyflips(*parypt)) {
        // Save it in list.
        bdrysteinerptlist->newindex((void **) &parypt);
        *parypt = rempt;
      }
    }
    if (b->verbose) {
      if (st_facref_count < bak_facref_count) {
        printf("  Removed %ld Steiner points in facets.\n", 
               bak_facref_count - st_facref_count);
      }
    }
    subvertstack->restart();
  }


  if (bdrysteinerptlist->objects > 0) {
    if (b->verbose) {
      printf("  %ld Steiner points remained in boundary.\n",
             bdrysteinerptlist->objects);
    }
  } // if


  // Accumulate the dynamic memory.
  totalworkmemory += (misseglist->totalmemory + misshlist->totalmemory +
                      bdrysteinerptlist->totalmemory);

  delete bdrysteinerptlist;
  delete misseglist;
  delete misshlist;
}